

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineBasicBlocks
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn)

{
  long lVar1;
  Instruction *this_00;
  BasicBlock *new_blk_ptr_00;
  pointer __p;
  bool bVar2;
  uint32_t uVar3;
  NonSemanticShaderDebugInfo100Instructions NVar4;
  const_iterator cVar5;
  DebugInfoManager *this_01;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var6;
  Instruction **ppIVar7;
  long *plVar8;
  long in_stack_00000008;
  pointer local_60;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_58;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  *local_50;
  long *local_48;
  Function *local_40;
  _func_int **local_38;
  
  plVar8 = *(long **)(in_stack_00000008 + 0x98);
  local_58._M_head_impl = (BasicBlock *)this;
  local_50 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)callee2caller;
  local_40 = calleeFn;
  while( true ) {
    plVar8 = plVar8 + 1;
    if (plVar8 == *(long **)(in_stack_00000008 + 0xa0)) break;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
              (local_50,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         *)inlined_at_ctx);
    uVar3 = Instruction::result_id(*(Instruction **)(*plVar8 + 8));
    local_60 = (pointer)CONCAT44(local_60._4_4_,uVar3);
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)new_blk_ptr,(key_type_conflict *)&local_60);
    _Var6._M_head_impl = local_58._M_head_impl;
    if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) goto LAB_001f4c04;
    NewLabel((InlinePass *)&stack0xffffffffffffffc8,(uint32_t)new_blocks);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&local_60,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&stack0xffffffffffffffc8);
    __p = local_60;
    local_60 = (pointer)0x0;
    std::__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             *)inlined_at_ctx,__p);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&local_60);
    if (local_38 != (_func_int **)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    lVar1 = *plVar8;
    ppIVar7 = (Instruction **)(lVar1 + 0x20);
    local_48 = plVar8;
    while (this_00 = *ppIVar7, plVar8 = local_48, this_00 != (Instruction *)(lVar1 + 0x18)) {
      NVar4 = Instruction::GetShader100DebugOpcode(this_00);
      if (NVar4 != NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
        new_blk_ptr_00 = (BasicBlock *)inlined_at_ctx->call_inst_line_;
        this_01 = IRContext::get_debug_info_mgr
                            ((IRContext *)
                             new_blocks[1].
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar3 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                          (this_01,(this_00->dbg_scope_).inlined_at_,
                           (DebugInlinedAtContext *)local_40);
        bVar2 = InlineSingleInstruction
                          ((InlinePass *)new_blocks,
                           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)new_blk_ptr,new_blk_ptr_00,this_00,uVar3);
        _Var6._M_head_impl = local_58._M_head_impl;
        if (!bVar2) goto LAB_001f4c04;
      }
      ppIVar7 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
  }
  (local_58._M_head_impl)->function_ = (Function *)inlined_at_ctx->call_inst_line_;
  _Var6._M_head_impl = (BasicBlock *)inlined_at_ctx;
LAB_001f4c04:
  (_Var6._M_head_impl)->function_ = (Function *)0x0;
  return (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>)
         local_58._M_head_impl;
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineBasicBlocks(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn) {
  auto callee_block_itr = calleeFn->begin();
  ++callee_block_itr;

  while (callee_block_itr != calleeFn->end()) {
    new_blocks->push_back(std::move(new_blk_ptr));
    const auto mapItr =
        callee2caller.find(callee_block_itr->GetLabelInst()->result_id());
    if (mapItr == callee2caller.end()) return nullptr;
    new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(mapItr->second));

    auto tail_inst_itr = callee_block_itr->end();
    for (auto inst_itr = callee_block_itr->begin(); inst_itr != tail_inst_itr;
         ++inst_itr) {
      // Don't inline function definition links, the calling function is not a
      // definition
      if (inst_itr->GetShader100DebugOpcode() ==
          NonSemanticShaderDebugInfo100DebugFunctionDefinition)
        continue;
      if (!InlineSingleInstruction(
              callee2caller, new_blk_ptr.get(), &*inst_itr,
              context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                  inst_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx))) {
        return nullptr;
      }
    }

    ++callee_block_itr;
  }
  return new_blk_ptr;
}